

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QRingChunk>::moveAppend
          (QGenericArrayOps<QRingChunk> *this,QRingChunk *b,QRingChunk *e)

{
  QRingChunk *this_00;
  ulong in_RDX;
  ulong in_RSI;
  QRingChunk *in_RDI;
  QRingChunk *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QRingChunk>::begin((QArrayDataPointer<QRingChunk> *)0x176537);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QRingChunk::QRingChunk(this_00,in_RDI);
      local_10 = local_10 + 0x28;
      (in_RDI->chunk).d.size = (in_RDI->chunk).d.size + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }